

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_frombytes.c
# Opt level: O0

uint64_t load_4(uchar *in)

{
  uint64_t result;
  uchar *in_local;
  
  return (ulong)*(uint *)in;
}

Assistant:

static crypto_uint64 load_4(const unsigned char *in)
{
  crypto_uint64 result;
  result = (crypto_uint64) in[0];
  result |= ((crypto_uint64) in[1]) << 8;
  result |= ((crypto_uint64) in[2]) << 16;
  result |= ((crypto_uint64) in[3]) << 24;
  return result;
}